

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleCloudKms.cpp
# Opt level: O0

void __thiscall Vault::GoogleCloudKms::encrypt(GoogleCloudKms *this,char *__block,int __edflag)

{
  Client *client;
  Parameters *in_RCX;
  undefined4 in_register_00000014;
  string local_88;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Url local_48;
  Parameters *local_28;
  Parameters *parameters_local;
  Path *path_local;
  GoogleCloudKms *this_local;
  
  parameters_local = (Parameters *)CONCAT44(in_register_00000014,__edflag);
  client = *(Client **)__block;
  local_28 = in_RCX;
  path_local = (Path *)__block;
  this_local = this;
  Vault::operator+(&local_88,"encrypt/",
                   (Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)parameters_local);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_68,&local_88);
  getUrl(&local_48,(GoogleCloudKms *)__block,&local_68);
  HttpConsumer::post((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,client,&local_48,local_28);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_48);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

std::optional<std::string>
Vault::GoogleCloudKms::encrypt(const Path &path, const Parameters &parameters) {
  return HttpConsumer::post(client_, getUrl(Path{"encrypt/" + path}),
                            parameters);
}